

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<PartialJPDPValuePair> * __thiscall
boost::shared_ptr<PartialJPDPValuePair>::operator=
          (shared_ptr<PartialJPDPValuePair> *this,shared_ptr<PartialJPDPValuePair> *r)

{
  shared_ptr<PartialJPDPValuePair> *in_RDI;
  shared_ptr<PartialJPDPValuePair> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<PartialJPDPValuePair> *)0x8d6a3e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }